

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

QLineEdit * __thiscall QDateTimeEdit::dateTimeFromText(QDateTimeEdit *this,QString *text)

{
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  QString *in_stack_00000008;
  QDateTimeEditPrivate *in_stack_00000010;
  QDateTimeEditPrivate *d;
  State state;
  int pos;
  QString copy;
  QLineEdit *this_00;
  undefined1 in_stack_fffffffffffffff7;
  State *state_00;
  
  state_00 = *(State **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QDateTimeEdit *)0x55ea3b);
  QString::QString((QString *)this_00,(QString *)in_RDI);
  QLineEdit::cursorPosition(this_00);
  QDateTimeEditPrivate::validateAndInterpret
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,state_00,
             (bool)in_stack_fffffffffffffff7);
  QString::~QString((QString *)0x55eab7);
  if (*(State **)(in_FS_OFFSET + 0x28) == state_00) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEdit::dateTimeFromText(const QString &text) const
{
    Q_D(const QDateTimeEdit);
    QString copy = text;
    int pos = d->edit->cursorPosition();
    QValidator::State state = QValidator::Acceptable;
    return d->validateAndInterpret(copy, pos, state);
}